

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O0

Sampler pbrt::Sampler::Create
                  (string *name,ParameterDictionary *parameters,Point2i fullRes,FileLoc *loc,
                  Allocator alloc)

{
  bool bVar1;
  FileLoc *in_RCX;
  ParameterDictionary *in_RDX;
  Allocator in_RSI;
  HaltonSampler *in_RDI;
  FileLoc *in_R8;
  char *in_R9;
  FileLoc *in_stack_00000060;
  ParameterDictionary *in_stack_00000068;
  Allocator in_stack_00000070;
  Allocator in_stack_00000078;
  Point2i in_stack_00000080;
  FileLoc *in_stack_00000088;
  ParameterDictionary *in_stack_00000090;
  Sampler *sampler;
  ParameterDictionary *in_stack_00000110;
  TaggedPointer<pbrt::PMJ02BNSampler,_pbrt::IndependentSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  __lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  FileLoc *in_stack_ffffffffffffff80;
  
  __lhs.bits = (uint64_t)in_RDI;
  TaggedPointer((Sampler *)in_RDI,in_RDI);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          __lhs.bits,(char *)in_RDI);
  if (bVar1) {
    ZSobolSampler::Create
              ((ParameterDictionary *)in_stack_00000070.memoryResource,in_stack_00000080,
               (FileLoc *)in_stack_00000068,in_stack_00000078);
    TaggedPointer<pbrt::ZSobolSampler>((Sampler *)__lhs.bits,(ZSobolSampler *)in_RDI);
    operator=((Sampler *)__lhs.bits,(Sampler *)in_RDI);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __lhs.bits,(char *)in_RDI);
    if (bVar1) {
      PaddedSobolSampler::Create(in_stack_00000068,in_stack_00000060,in_stack_00000070);
      TaggedPointer<pbrt::PaddedSobolSampler>((Sampler *)__lhs.bits,(PaddedSobolSampler *)in_RDI);
      operator=((Sampler *)__lhs.bits,(Sampler *)in_RDI);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs.bits,(char *)in_RDI);
      if (bVar1) {
        HaltonSampler::Create
                  ((ParameterDictionary *)in_stack_00000070.memoryResource,in_stack_00000080,
                   (FileLoc *)in_stack_00000068,in_stack_00000078);
        TaggedPointer<pbrt::HaltonSampler>((Sampler *)__lhs.bits,in_RDI);
        operator=((Sampler *)__lhs.bits,(Sampler *)in_RDI);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs.bits,(char *)in_RDI);
        if (bVar1) {
          SobolSampler::Create
                    ((ParameterDictionary *)in_stack_00000070.memoryResource,in_stack_00000080,
                     (FileLoc *)in_stack_00000068,in_stack_00000078);
          TaggedPointer<pbrt::SobolSampler>((Sampler *)__lhs.bits,(SobolSampler *)in_RDI);
          operator=((Sampler *)__lhs.bits,(Sampler *)in_RDI);
          in_stack_ffffffffffffff78 = in_R9;
          in_stack_ffffffffffffff80 = in_RCX;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs.bits,(char *)in_RDI);
          if (bVar1) {
            PMJ02BNSampler::Create(in_RDX,in_R8,in_RSI);
            TaggedPointer<pbrt::PMJ02BNSampler>((Sampler *)__lhs.bits,(PMJ02BNSampler *)in_RDI);
            operator=((Sampler *)__lhs.bits,(Sampler *)in_RDI);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__lhs.bits,(char *)in_RDI);
            if (bVar1) {
              IndependentSampler::Create(in_RDX,in_R8,in_RSI);
              TaggedPointer<pbrt::IndependentSampler>
                        ((Sampler *)__lhs.bits,(IndependentSampler *)in_RDI);
              operator=((Sampler *)__lhs.bits,(Sampler *)in_RDI);
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)__lhs.bits,(char *)in_RDI);
              if (!bVar1) {
                ErrorExit<std::__cxx11::string_const&>
                          (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                           in_stack_ffffffffffffff70);
              }
              StratifiedSampler::Create(in_stack_00000090,in_stack_00000088,(Allocator)loc);
              TaggedPointer<pbrt::StratifiedSampler>
                        ((Sampler *)__lhs.bits,(StratifiedSampler *)in_RDI);
              operator=((Sampler *)__lhs.bits,(Sampler *)in_RDI);
            }
          }
        }
      }
    }
  }
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)in_RDI);
  if (bVar1) {
    ParameterDictionary::ReportUnused(in_stack_00000110);
    return (Sampler)(TaggedPointer<pbrt::PMJ02BNSampler,_pbrt::IndependentSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                     )__lhs.bits;
  }
  ErrorExit<std::__cxx11::string_const&>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
}

Assistant:

Sampler Sampler::Create(const std::string &name, const ParameterDictionary &parameters,
                        Point2i fullRes, const FileLoc *loc, Allocator alloc) {
    Sampler sampler = nullptr;
    if (name == "zsobol")
        sampler = ZSobolSampler::Create(parameters, fullRes, loc, alloc);
    // Create remainder of _Sampler_ types
    else if (name == "paddedsobol")
        sampler = PaddedSobolSampler::Create(parameters, loc, alloc);
    else if (name == "halton")
        sampler = HaltonSampler::Create(parameters, fullRes, loc, alloc);
    else if (name == "sobol")
        sampler = SobolSampler::Create(parameters, fullRes, loc, alloc);
    else if (name == "pmj02bn")
        sampler = PMJ02BNSampler::Create(parameters, loc, alloc);
    else if (name == "independent")
        sampler = IndependentSampler::Create(parameters, loc, alloc);
    else if (name == "stratified")
        sampler = StratifiedSampler::Create(parameters, loc, alloc);
    else
        ErrorExit(loc, "%s: sampler type unknown.", name);
    if (!sampler)
        ErrorExit(loc, "%s: unable to create sampler.", name);
    parameters.ReportUnused();

    return sampler;
}